

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

bool __thiscall
ON_ComponentIdHash32Table::RemoveManifestItem
          (ON_ComponentIdHash32Table *this,ON_ComponentManifestItem_PRIVATE *manifest_item)

{
  ON_UUID *pOVar1;
  bool bVar2;
  ON__UINT32 hash32;
  ON_UUID *pOVar3;
  ON_ComponentManifestHash32TableItem *hash_table_item;
  ON_UUID id;
  ON_UUID_struct local_28;
  
  pOVar3 = &(manifest_item->super_ON_ComponentManifestItem).m_id;
  if (manifest_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar3 = &ON_nil_uuid;
  }
  pOVar1 = &ON_nil_uuid;
  if (manifest_item != (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar1 = &(manifest_item->super_ON_ComponentManifestItem).m_id;
  }
  local_28.Data4 = *&pOVar1->Data4;
  local_28.Data1 = pOVar3->Data1;
  local_28.Data2 = pOVar3->Data2;
  local_28.Data3 = pOVar3->Data3;
  bVar2 = ::operator==(&ON_nil_uuid,&local_28);
  if (!bVar2) {
    hash32 = IdHash32(&local_28);
    for (hash_table_item =
              (ON_ComponentManifestHash32TableItem *)
              ON_Hash32Table::FirstItemWithHash(&this->super_ON_Hash32Table,hash32);
        hash_table_item != (ON_ComponentManifestHash32TableItem *)0x0;
        hash_table_item =
             (ON_ComponentManifestHash32TableItem *)
             ON_Hash32Table::NextItemWithHash
                       (&this->super_ON_Hash32Table,&hash_table_item->super_ON_Hash32TableItem)) {
      if ((hash_table_item->m_manifest_item == manifest_item) &&
         (bVar2 = ON_Hash32Table::RemoveItem
                            (&this->super_ON_Hash32Table,&hash_table_item->super_ON_Hash32TableItem)
         , bVar2)) {
        ON_ManifestHash32TableItemFixedSizePool::ReturnHashTableItem(this->m_fsp,hash_table_item);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RemoveManifestItem(
    const class ON_ComponentManifestItem_PRIVATE* manifest_item
    )
  {
    const ON_UUID id = IdFromManifestItem(manifest_item);
    if ( ON_nil_uuid == id )
      return false;
    const ON__UINT32 hash32 = ON_ComponentIdHash32Table::IdHash32(id);

    for (const ON_Hash32TableItem* hash_table_item = FirstItemWithHash(hash32); nullptr != hash_table_item; hash_table_item = NextItemWithHash(hash_table_item))
    {
      if (manifest_item == ((const ON_ComponentManifestHash32TableItem*)hash_table_item)->m_manifest_item)
      {
        if (RemoveItem(const_cast<ON_Hash32TableItem*>(hash_table_item)))
        {
          m_fsp.ReturnHashTableItem((ON_ComponentManifestHash32TableItem*)hash_table_item);
          return true;
        }
      }
    }

    return false;
  }